

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O0

void HighsHashHelpers::sparse_combine(u64 *hash,HighsInt index,u64 value)

{
  ulong uVar1;
  ulong uVar2;
  u64 e;
  u64 uVar3;
  long in_RDX;
  uint in_ESI;
  ulong *in_RDI;
  u64 in_stack_00000008;
  u64 in_stack_00000010;
  u64 degree;
  u64 a;
  
  e = in_RDX << 1;
  M61();
  uVar3 = *(u64 *)(&DAT_00883a20 + (long)(int)(in_ESI & 0x3f) * 8);
  M61();
  modexp_M61(uVar3,e);
  uVar3 = multiply_modM61(in_stack_00000010,in_stack_00000008);
  *in_RDI = uVar3 + *in_RDI;
  uVar1 = *in_RDI;
  uVar2 = *in_RDI;
  uVar3 = M61();
  *in_RDI = (uVar1 >> 0x3d) + (uVar2 & uVar3);
  uVar1 = *in_RDI;
  uVar3 = M61();
  if (uVar3 <= uVar1) {
    uVar3 = M61();
    *in_RDI = *in_RDI - uVar3;
  }
  return;
}

Assistant:

static void sparse_combine(u64& hash, HighsInt index, u64 value) {
    // we take each value of the sparse hash as coefficient for a polynomial
    // of the finite field modulo the mersenne prime 2^61-1 where the monomial
    // for a sparse entry has the degree of its index. We evaluate the
    // polynomial at a random constant. This allows to compute the hashes of
    // sparse vectors independently of each others nonzero contribution and
    // therefore allows to use the order of best access patterns for cache
    // performance. E.g. we can compute a strong hash value for parallel row and
    // column detection and only need to loop over the nonzeros once in
    // arbitrary order. This comes at the expense of more expensive hash
    // calculations as it would be more efficient to evaluate the polynomial
    // with horners scheme, but allows for parallelization and arbitrary order.
    // Since we have 64 random constants available, we slightly improve
    // the scheme by using a lower degree polynomial with 64 variables
    // which we evaluate at the random vector of 64.

    // make sure input value is never zero and at most 61bits are used
    value = ((value << 1) & M61()) | 1;

    // make sure that the constant has at most 61 bits, as otherwise the modulo
    // algorithm for multiplication mod M61 might not work properly due to
    // overflow
    u64 a = c[index & 63] & M61();
    u64 degree = (static_cast<u64>(index) >> 6) + 1;

    hash += multiply_modM61(value, modexp_M61(a, degree));
    hash = (hash >> 61) + (hash & M61());
    if (hash >= M61()) hash -= M61();
    assert(hash < M61());
  }